

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QTextUndoCommand>::emplace<QTextUndoCommand_const&>
          (QPodArrayOps<QTextUndoCommand> *this,qsizetype i,QTextUndoCommand *args)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 aVar4;
  undefined8 uVar5;
  bool bVar6;
  qsizetype qVar7;
  QTextUndoCommand *pQVar8;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QTextUndoCommand> *in_RDI;
  long in_FS_OFFSET;
  QTextUndoCommand *where;
  GrowthPosition pos;
  bool detach;
  QTextUndoCommand tmp;
  QArrayDataPointer<QTextUndoCommand> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar10;
  QArrayDataPointer<QTextUndoCommand> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar6 = QArrayDataPointer<QTextUndoCommand>::needsDetach(in_stack_ffffffffffffffb0);
  uVar10 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffffbc);
  if (!bVar6) {
    if ((in_RSI == in_RDI->size) &&
       (qVar7 = QArrayDataPointer<QTextUndoCommand>::freeSpaceAtEnd
                          ((QArrayDataPointer<QTextUndoCommand> *)
                           CONCAT44(uVar10,in_stack_ffffffffffffffb8)), qVar7 != 0)) {
      pQVar8 = QArrayDataPointer<QTextUndoCommand>::end(in_stack_ffffffffffffffb0);
      uVar2 = *in_RDX;
      pQVar8->command = (short)uVar2;
      pQVar8->field_0x2 = (char)((ulong)uVar2 >> 0x10);
      pQVar8->operation = (char)((ulong)uVar2 >> 0x18);
      pQVar8->format = (int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[1];
      pQVar8->strPos = (int)uVar2;
      pQVar8->pos = (int)((ulong)uVar2 >> 0x20);
      pQVar8->field_8 = *(anon_union_8_4_8516307b_for_QTextUndoCommand_8 *)(in_RDX + 2);
      *(undefined8 *)&pQVar8->revision = in_RDX[3];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_007e1e59;
    }
    if ((in_RSI == 0) &&
       (qVar7 = QArrayDataPointer<QTextUndoCommand>::freeSpaceAtBegin
                          ((QArrayDataPointer<QTextUndoCommand> *)
                           CONCAT44(uVar10,in_stack_ffffffffffffffb8)), qVar7 != 0)) {
      pQVar8 = QArrayDataPointer<QTextUndoCommand>::begin
                         ((QArrayDataPointer<QTextUndoCommand> *)0x7e1d36);
      uVar2 = *in_RDX;
      pQVar8[-1].command = (short)uVar2;
      pQVar8[-1].field_0x2 = (char)((ulong)uVar2 >> 0x10);
      pQVar8[-1].operation = (char)((ulong)uVar2 >> 0x18);
      pQVar8[-1].format = (int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[1];
      pQVar8[-1].strPos = (int)uVar2;
      pQVar8[-1].pos = (int)((ulong)uVar2 >> 0x20);
      pQVar8[-1].field_8 = *(anon_union_8_4_8516307b_for_QTextUndoCommand_8 *)(in_RDX + 2);
      *(undefined8 *)&pQVar8[-1].revision = in_RDX[3];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_007e1e59;
    }
  }
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  aVar4 = *(anon_union_8_4_8516307b_for_QTextUndoCommand_8 *)(in_RDX + 2);
  uVar5 = in_RDX[3];
  uVar9 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar9 = 1;
  }
  QArrayDataPointer<QTextUndoCommand>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QTextUndoCommand **)CONCAT44(uVar10,uVar9),in_stack_ffffffffffffffb0);
  pQVar8 = createHole((QPodArrayOps<QTextUndoCommand> *)this_00,
                      (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
                      CONCAT44(uVar10,uVar9));
  pQVar8->command = (short)uVar2;
  pQVar8->field_0x2 = (char)((ulong)uVar2 >> 0x10);
  pQVar8->operation = (char)((ulong)uVar2 >> 0x18);
  pQVar8->format = (int)((ulong)uVar2 >> 0x20);
  pQVar8->strPos = (int)uVar3;
  pQVar8->pos = (int)((ulong)uVar3 >> 0x20);
  pQVar8->field_8 = aVar4;
  *(undefined8 *)&pQVar8->revision = uVar5;
LAB_007e1e59:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }